

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

Matrix * __thiscall Matrix::mult(Matrix *this,Matrix *m)

{
  int iVar1;
  int col;
  uint uVar2;
  uint uVar3;
  double **ppdVar4;
  double *pdVar5;
  double **ppdVar6;
  double *pdVar7;
  Matrix *this_00;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  string local_50;
  
  this_00 = (Matrix *)operator_new(0x30);
  iVar1 = this->rowNo;
  col = m->colNo;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"result of multiply of two matrix:","");
  Matrix(this_00,iVar1,col,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  uVar2 = this->colNo;
  if (uVar2 == m->rowNo) {
    iVar1 = this->rowNo;
    if (0 < (long)iVar1) {
      uVar3 = m->colNo;
      lVar8 = 0;
      do {
        if (0 < (int)uVar3) {
          ppdVar4 = this->array;
          uVar9 = 0;
          do {
            if (0 < (int)uVar2) {
              pdVar5 = ppdVar4[lVar8];
              ppdVar6 = m->array;
              pdVar7 = this_00->array[lVar8];
              dVar11 = pdVar7[uVar9];
              uVar10 = 0;
              do {
                dVar11 = dVar11 + pdVar5[uVar10] * ppdVar6[uVar10][uVar9];
                pdVar7[uVar9] = dVar11;
                uVar10 = uVar10 + 1;
              } while (uVar2 != uVar10);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar3);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar1);
    }
  }
  else {
    this_00 = (Matrix *)0x0;
  }
  return this_00;
}

Assistant:

Matrix* Matrix::mult(Matrix *m)
{

    Matrix *n = new Matrix(rowNo, m->colNo, "result of multiply of two matrix:");
    if (colNo == m->rowNo)
    {

        for (int i = 0; i < rowNo; i++)
        {
            for (int j = 0; j < m->colNo; j++)
            {
                for (int k = 0; k < colNo; k++)
                {
                    n->array[i][j]  = array[i][k] * m->array[k][j] + n->array[i][j];
                }
            }
        }

    }

    else
    {
        return 0;

    }
    return n;
}